

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool tdefl_compress_normal(tdefl_compressor *d)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  mz_uint16 mVar4;
  mz_uint16 mVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  bool bVar10;
  int local_1cc;
  ulong local_1c8;
  uint local_1b4;
  ulong local_1a8;
  uint local_18c;
  uint local_17c;
  mz_uint local_170;
  mz_uint local_16c;
  uint local_154;
  int local_150;
  ulong local_148;
  int n;
  mz_uint8 c_2;
  mz_uint hash_1;
  mz_uint ins_pos_1;
  mz_uint dst_pos_1;
  mz_uint8 c_1;
  mz_uint8 c;
  mz_uint8 *pSrc_end;
  uint local_110;
  mz_uint num_bytes_to_process;
  mz_uint hash;
  mz_uint ins_pos;
  mz_uint dst_pos;
  mz_uint cur_pos;
  mz_uint cur_match_len;
  mz_uint cur_match_dist;
  mz_uint len_to_move;
  tdefl_flush flush;
  size_t src_buf_left;
  mz_uint8 *pSrc;
  tdefl_compressor *d_local;
  mz_uint16 s01;
  mz_uint16 *pmStack_d0;
  mz_uint16 c01;
  mz_uint16 *q;
  mz_uint16 *p;
  mz_uint16 *s;
  uint local_b0;
  mz_uint num_probes_left;
  mz_uint probe_len;
  mz_uint next_probe_pos;
  mz_uint probe_pos;
  mz_uint match_len;
  mz_uint pos;
  mz_uint dist;
  mz_uint *local_90;
  uint local_84;
  uint local_80;
  uint local_7c;
  mz_uint8 *local_78;
  byte local_69;
  mz_uint8 *local_68;
  byte local_59;
  mz_uint8 *local_58;
  uint local_50;
  uint local_4c;
  mz_uint32 s1_2;
  mz_uint32 s0_2;
  mz_uint8 *local_40;
  uint local_38;
  uint local_34;
  mz_uint32 s1_1;
  mz_uint32 s0_1;
  mz_uint8 *local_28;
  uint local_20;
  uint local_1c;
  mz_uint32 s1;
  mz_uint32 s0;
  mz_uint8 *local_10;
  
  src_buf_left = (size_t)d->m_pSrc;
  _len_to_move = d->m_src_buf_left;
  cur_match_dist = d->m_flush;
  pSrc = (mz_uint8 *)d;
  while( true ) {
    bVar10 = true;
    if ((_len_to_move == 0) && (bVar10 = false, cur_match_dist != 0)) {
      bVar10 = *(int *)(pSrc + 0x28) != 0;
    }
    if (!bVar10) break;
    if ((uint)(*(int *)(pSrc + 0x28) + *(int *)(pSrc + 0x2c)) < 2) {
      while( true ) {
        bVar10 = false;
        if (_len_to_move != 0) {
          bVar10 = *(uint *)(pSrc + 0x28) < 0x102;
        }
        if (!bVar10) break;
        sVar9 = src_buf_left + 1;
        bVar1 = *(byte *)src_buf_left;
        uVar6 = *(int *)(pSrc + 0x24) + *(int *)(pSrc + 0x28) & 0x7fff;
        _len_to_move = _len_to_move - 1;
        pSrc[(ulong)uVar6 + 200] = bVar1;
        if (uVar6 < 0x101) {
          pSrc[(ulong)(uVar6 + 0x8000) + 200] = bVar1;
        }
        iVar8 = *(int *)(pSrc + 0x28);
        *(int *)(pSrc + 0x28) = iVar8 + 1;
        src_buf_left = sVar9;
        if (2 < (uint)(iVar8 + 1 + *(int *)(pSrc + 0x2c))) {
          uVar6 = (*(int *)(pSrc + 0x24) + *(int *)(pSrc + 0x28)) - 3;
          uVar7 = ((uint)pSrc[(ulong)(uVar6 & 0x7fff) + 200] << 10 ^
                   (uint)pSrc[(ulong)((*(int *)(pSrc + 0x24) + *(int *)(pSrc + 0x28)) - 2U & 0x7fff)
                              + 200] << 5 ^ (uint)bVar1) & 0x7fff;
          *(undefined2 *)(pSrc + (ulong)(uVar6 & 0x7fff) * 2 + 0x192aa) =
               *(undefined2 *)(pSrc + (ulong)uVar7 * 2 + 0x292aa);
          *(short *)(pSrc + (ulong)uVar7 * 2 + 0x292aa) = (short)uVar6;
        }
      }
    }
    else {
      uVar6 = *(int *)(pSrc + 0x24) + *(int *)(pSrc + 0x28);
      num_bytes_to_process = (*(int *)(pSrc + 0x24) + *(int *)(pSrc + 0x28)) - 2;
      local_110 = (uint)pSrc[(ulong)(num_bytes_to_process & 0x7fff) + 200] << 5 ^
                  (uint)pSrc[(ulong)((*(int *)(pSrc + 0x24) + *(int *)(pSrc + 0x28)) - 1U & 0x7fff)
                             + 200];
      if (_len_to_move < 0x102 - *(int *)(pSrc + 0x28)) {
        local_148 = _len_to_move;
      }
      else {
        local_148 = (ulong)(0x102 - *(int *)(pSrc + 0x28));
      }
      sVar9 = src_buf_left + (local_148 & 0xffffffff);
      _len_to_move = _len_to_move - (local_148 & 0xffffffff);
      *(int *)(pSrc + 0x28) = (int)local_148 + *(int *)(pSrc + 0x28);
      while (hash = uVar6 & 0x7fff, src_buf_left != sVar9) {
        bVar1 = *(byte *)src_buf_left;
        pSrc[(ulong)hash + 200] = bVar1;
        if (hash < 0x101) {
          pSrc[(ulong)(hash + 0x8000) + 200] = bVar1;
        }
        local_110 = (local_110 << 5 ^ (uint)bVar1) & 0x7fff;
        *(undefined2 *)(pSrc + (ulong)(num_bytes_to_process & 0x7fff) * 2 + 0x192aa) =
             *(undefined2 *)(pSrc + (ulong)local_110 * 2 + 0x292aa);
        *(short *)(pSrc + (ulong)local_110 * 2 + 0x292aa) = (short)num_bytes_to_process;
        uVar6 = hash + 1;
        num_bytes_to_process = num_bytes_to_process + 1;
        src_buf_left = src_buf_left + 1;
      }
    }
    if (0x8000U - *(int *)(pSrc + 0x28) < *(uint *)(pSrc + 0x2c)) {
      local_150 = 0x8000 - *(int *)(pSrc + 0x28);
    }
    else {
      local_150 = *(int *)(pSrc + 0x2c);
    }
    *(int *)(pSrc + 0x2c) = local_150;
    if ((cur_match_dist == 0) && (*(uint *)(pSrc + 0x28) < 0x102)) break;
    cur_match_len = 1;
    cur_pos = 0;
    if (*(int *)(pSrc + 0x68) == 0) {
      local_154 = 2;
    }
    else {
      local_154 = *(uint *)(pSrc + 0x68);
    }
    dst_pos = local_154;
    uVar6 = *(uint *)(pSrc + 0x24) & 0x7fff;
    if ((*(uint *)(pSrc + 0x10) & 0x90000) == 0) {
      local_7c = *(uint *)(pSrc + 0x24);
      local_80 = *(uint *)(pSrc + 0x2c);
      local_84 = *(uint *)(pSrc + 0x28);
      local_78 = pSrc;
      local_90 = &cur_pos;
      _pos = &dst_pos;
      probe_len = local_7c & 0x7fff;
      next_probe_pos = local_154;
      s._4_4_ = *(int *)(pSrc + (long)(int)(uint)(0x1f < local_154) * 4 + 0x14);
      p = (mz_uint16 *)(pSrc + (ulong)probe_len + 200);
      probe_pos = probe_len;
      d_local._6_2_ = TDEFL_READ_UNALIGNED_WORD(pSrc + (ulong)((probe_len + local_154) - 1) + 200);
      d_local._4_2_ = TDEFL_READ_UNALIGNED_WORD2(p);
      if (0x102 < local_84) {
        __assert_fail("max_match_len <= TDEFL_MAX_MATCH_LEN",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/miniz/miniz.c"
                      ,0x57a,
                      "void tdefl_find_match(tdefl_compressor *, mz_uint, mz_uint, mz_uint, mz_uint *, mz_uint *)"
                     );
      }
      if (next_probe_pos < local_84) {
LAB_001979d1:
        s._4_4_ = s._4_4_ + -1;
        if (((s._4_4_ != 0) &&
            (num_probes_left = (mz_uint)*(ushort *)(local_78 + (ulong)probe_len * 2 + 0x192aa),
            num_probes_left != 0)) &&
           (match_len = local_7c - num_probes_left & 0xffff, match_len <= local_80)) {
          probe_len = num_probes_left & 0x7fff;
          mVar4 = TDEFL_READ_UNALIGNED_WORD
                            (local_78 + (ulong)((probe_len + next_probe_pos) - 1) + 200);
          if (mVar4 == d_local._6_2_) goto LAB_00197b7b;
          num_probes_left = (mz_uint)*(ushort *)(local_78 + (ulong)probe_len * 2 + 0x192aa);
          if ((num_probes_left != 0) &&
             (match_len = local_7c - num_probes_left & 0xffff, match_len <= local_80)) {
            probe_len = num_probes_left & 0x7fff;
            mVar4 = TDEFL_READ_UNALIGNED_WORD
                              (local_78 + (ulong)((probe_len + next_probe_pos) - 1) + 200);
            if (mVar4 == d_local._6_2_) goto LAB_00197b7b;
            num_probes_left = (mz_uint)*(ushort *)(local_78 + (ulong)probe_len * 2 + 0x192aa);
            if ((num_probes_left != 0) &&
               (match_len = local_7c - num_probes_left & 0xffff, match_len <= local_80))
            goto LAB_00197b31;
          }
        }
      }
    }
    else if ((*(int *)(pSrc + 0x2c) != 0) && ((*(uint *)(pSrc + 0x10) & 0x80000) == 0)) {
      dst_pos = 0;
      while ((dst_pos < *(uint *)(pSrc + 0x28) &&
             (pSrc[(ulong)(uVar6 + dst_pos) + 200] == pSrc[(ulong)(uVar6 - 1 & 0x7fff) + 200]))) {
        dst_pos = dst_pos + 1;
      }
      bVar10 = 2 < dst_pos;
      if (!bVar10) {
        dst_pos = 0;
      }
      cur_pos = (mz_uint)bVar10;
    }
LAB_00197e4c:
    if ((((dst_pos == 3) && (0x1fff < cur_pos)) || (uVar6 == cur_pos)) ||
       (((*(uint *)(pSrc + 0x10) & 0x20000) != 0 && (dst_pos < 6)))) {
      dst_pos = 0;
      cur_pos = 0;
    }
    if (*(int *)(pSrc + 0x68) == 0) {
      if (cur_pos == 0) {
        if (uVar6 < 0x8100) {
          local_1a8 = (ulong)uVar6;
        }
        else {
          local_1a8 = 0x8100;
        }
        local_69 = pSrc[local_1a8 + 200];
        local_68 = pSrc;
        *(int *)(pSrc + 0x54) = *(int *)(pSrc + 0x54) + 1;
        pbVar2 = *(byte **)(pSrc + 0x30);
        *(byte **)(pSrc + 0x30) = pbVar2 + 1;
        *pbVar2 = local_69;
        **(undefined1 **)(pSrc + 0x38) = (char)((int)(uint)**(byte **)(pSrc + 0x38) >> 1);
        iVar8 = *(int *)(pSrc + 0x50);
        *(int *)(pSrc + 0x50) = iVar8 + -1;
        if (iVar8 + -1 == 0) {
          pSrc[0x50] = '\b';
          pSrc[0x51] = '\0';
          pSrc[0x52] = '\0';
          pSrc[0x53] = '\0';
          lVar3 = *(long *)(pSrc + 0x30);
          *(long *)(pSrc + 0x30) = lVar3 + 1;
          *(long *)(pSrc + 0x38) = lVar3;
        }
        *(short *)(pSrc + (ulong)local_69 * 2 + 0x81ca) =
             *(short *)(pSrc + (ulong)local_69 * 2 + 0x81ca) + 1;
      }
      else if (((*(int *)(pSrc + 0x1c) == 0) && ((*(uint *)(pSrc + 0x10) & 0x10000) == 0)) &&
              (dst_pos < 0x80)) {
        if (uVar6 < 0x8100) {
          local_1c8 = (ulong)uVar6;
        }
        else {
          local_1c8 = 0x8100;
        }
        *(uint *)(pSrc + 0x6c) = (uint)pSrc[local_1c8 + 200];
        *(mz_uint *)(pSrc + 100) = cur_pos;
        *(mz_uint *)(pSrc + 0x68) = dst_pos;
      }
      else {
        local_40 = pSrc;
        s0_2 = dst_pos;
        s1_2 = cur_pos;
        if (((dst_pos < 3) || (cur_pos == 0)) || (0x8000 < cur_pos)) {
          __assert_fail("(match_len >= TDEFL_MIN_MATCH_LEN) && (match_dist >= 1) && (match_dist <= TDEFL_LZ_DICT_SIZE)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/miniz/miniz.c"
                        ,0x6a0,"void tdefl_record_match(tdefl_compressor *, mz_uint, mz_uint)");
        }
        *(mz_uint *)(pSrc + 0x54) = dst_pos + *(int *)(pSrc + 0x54);
        **(char **)(pSrc + 0x30) = (char)dst_pos + -3;
        s1_2 = cur_pos - 1;
        *(char *)(*(long *)(pSrc + 0x30) + 1) = (char)s1_2;
        *(char *)(*(long *)(pSrc + 0x30) + 2) = (char)(s1_2 >> 8);
        *(long *)(pSrc + 0x30) = *(long *)(pSrc + 0x30) + 3;
        **(byte **)(pSrc + 0x38) = (byte)((int)(uint)**(byte **)(pSrc + 0x38) >> 1) | 0x80;
        iVar8 = *(int *)(pSrc + 0x50);
        *(int *)(pSrc + 0x50) = iVar8 + -1;
        if (iVar8 + -1 == 0) {
          pSrc[0x50] = '\b';
          pSrc[0x51] = '\0';
          pSrc[0x52] = '\0';
          pSrc[0x53] = '\0';
          lVar3 = *(long *)(pSrc + 0x30);
          *(long *)(pSrc + 0x30) = lVar3 + 1;
          *(long *)(pSrc + 0x38) = lVar3;
        }
        local_4c = (uint)""[s1_2 & 0x1ff];
        local_50 = (uint)""[s1_2 >> 8 & 0x7f];
        local_1b4 = local_50;
        if (s1_2 < 0x200) {
          local_1b4 = local_4c;
        }
        *(short *)(pSrc + (ulong)local_1b4 * 2 + 0x840a) =
             *(short *)(pSrc + (ulong)local_1b4 * 2 + 0x840a) + 1;
        if (2 < dst_pos) {
          *(short *)(pSrc + (ulong)s_tdefl_len_sym[dst_pos - 3] * 2 + 0x81ca) =
               *(short *)(pSrc + (ulong)s_tdefl_len_sym[dst_pos - 3] * 2 + 0x81ca) + 1;
        }
        cur_match_len = dst_pos;
      }
    }
    else if (*(uint *)(pSrc + 0x68) < dst_pos) {
      local_58 = pSrc;
      local_59 = (byte)*(undefined4 *)(pSrc + 0x6c);
      *(int *)(pSrc + 0x54) = *(int *)(pSrc + 0x54) + 1;
      pbVar2 = *(byte **)(pSrc + 0x30);
      *(byte **)(pSrc + 0x30) = pbVar2 + 1;
      *pbVar2 = local_59;
      **(undefined1 **)(pSrc + 0x38) = (char)((int)(uint)**(byte **)(pSrc + 0x38) >> 1);
      iVar8 = *(int *)(pSrc + 0x50);
      *(int *)(pSrc + 0x50) = iVar8 + -1;
      if (iVar8 + -1 == 0) {
        pSrc[0x50] = '\b';
        pSrc[0x51] = '\0';
        pSrc[0x52] = '\0';
        pSrc[0x53] = '\0';
        lVar3 = *(long *)(pSrc + 0x30);
        *(long *)(pSrc + 0x30) = lVar3 + 1;
        *(long *)(pSrc + 0x38) = lVar3;
      }
      *(short *)(pSrc + (ulong)local_59 * 2 + 0x81ca) =
           *(short *)(pSrc + (ulong)local_59 * 2 + 0x81ca) + 1;
      if (dst_pos < 0x80) {
        *(uint *)(pSrc + 0x6c) = (uint)pSrc[(ulong)uVar6 + 200];
        *(mz_uint *)(pSrc + 100) = cur_pos;
        *(mz_uint *)(pSrc + 0x68) = dst_pos;
      }
      else {
        local_10 = pSrc;
        s0 = dst_pos;
        s1 = cur_pos;
        if (((dst_pos < 3) || (cur_pos == 0)) || (0x8000 < cur_pos)) {
          __assert_fail("(match_len >= TDEFL_MIN_MATCH_LEN) && (match_dist >= 1) && (match_dist <= TDEFL_LZ_DICT_SIZE)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/miniz/miniz.c"
                        ,0x6a0,"void tdefl_record_match(tdefl_compressor *, mz_uint, mz_uint)");
        }
        *(mz_uint *)(pSrc + 0x54) = dst_pos + *(int *)(pSrc + 0x54);
        **(char **)(pSrc + 0x30) = (char)dst_pos + -3;
        s1 = cur_pos - 1;
        *(char *)(*(long *)(pSrc + 0x30) + 1) = (char)s1;
        *(char *)(*(long *)(pSrc + 0x30) + 2) = (char)(s1 >> 8);
        *(long *)(pSrc + 0x30) = *(long *)(pSrc + 0x30) + 3;
        **(byte **)(pSrc + 0x38) = (byte)((int)(uint)**(byte **)(pSrc + 0x38) >> 1) | 0x80;
        iVar8 = *(int *)(pSrc + 0x50);
        *(int *)(pSrc + 0x50) = iVar8 + -1;
        if (iVar8 + -1 == 0) {
          pSrc[0x50] = '\b';
          pSrc[0x51] = '\0';
          pSrc[0x52] = '\0';
          pSrc[0x53] = '\0';
          lVar3 = *(long *)(pSrc + 0x30);
          *(long *)(pSrc + 0x30) = lVar3 + 1;
          *(long *)(pSrc + 0x38) = lVar3;
        }
        local_1c = (uint)""[s1 & 0x1ff];
        local_20 = (uint)""[s1 >> 8 & 0x7f];
        local_17c = local_20;
        if (s1 < 0x200) {
          local_17c = local_1c;
        }
        *(short *)(pSrc + (ulong)local_17c * 2 + 0x840a) =
             *(short *)(pSrc + (ulong)local_17c * 2 + 0x840a) + 1;
        if (2 < dst_pos) {
          *(short *)(pSrc + (ulong)s_tdefl_len_sym[dst_pos - 3] * 2 + 0x81ca) =
               *(short *)(pSrc + (ulong)s_tdefl_len_sym[dst_pos - 3] * 2 + 0x81ca) + 1;
        }
        pSrc[0x68] = '\0';
        pSrc[0x69] = '\0';
        pSrc[0x6a] = '\0';
        pSrc[0x6b] = '\0';
        cur_match_len = dst_pos;
      }
    }
    else {
      s0_1 = *(mz_uint32 *)(pSrc + 0x68);
      s1_1 = *(mz_uint32 *)(pSrc + 100);
      local_28 = pSrc;
      if (((s0_1 < 3) || (s1_1 == 0)) || (0x8000 < s1_1)) {
        __assert_fail("(match_len >= TDEFL_MIN_MATCH_LEN) && (match_dist >= 1) && (match_dist <= TDEFL_LZ_DICT_SIZE)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/miniz/miniz.c"
                      ,0x6a0,"void tdefl_record_match(tdefl_compressor *, mz_uint, mz_uint)");
      }
      *(mz_uint32 *)(pSrc + 0x54) = s0_1 + *(int *)(pSrc + 0x54);
      **(char **)(pSrc + 0x30) = (char)s0_1 + -3;
      s1_1 = s1_1 - 1;
      *(char *)(*(long *)(pSrc + 0x30) + 1) = (char)s1_1;
      *(char *)(*(long *)(pSrc + 0x30) + 2) = (char)(s1_1 >> 8);
      *(long *)(pSrc + 0x30) = *(long *)(pSrc + 0x30) + 3;
      **(byte **)(pSrc + 0x38) = (byte)((int)(uint)**(byte **)(pSrc + 0x38) >> 1) | 0x80;
      iVar8 = *(int *)(pSrc + 0x50);
      *(int *)(pSrc + 0x50) = iVar8 + -1;
      if (iVar8 + -1 == 0) {
        pSrc[0x50] = '\b';
        pSrc[0x51] = '\0';
        pSrc[0x52] = '\0';
        pSrc[0x53] = '\0';
        lVar3 = *(long *)(pSrc + 0x30);
        *(long *)(pSrc + 0x30) = lVar3 + 1;
        *(long *)(pSrc + 0x38) = lVar3;
      }
      local_34 = (uint)""[s1_1 & 0x1ff];
      local_38 = (uint)""[s1_1 >> 8 & 0x7f];
      local_18c = local_38;
      if (s1_1 < 0x200) {
        local_18c = local_34;
      }
      *(short *)(pSrc + (ulong)local_18c * 2 + 0x840a) =
           *(short *)(pSrc + (ulong)local_18c * 2 + 0x840a) + 1;
      if (2 < s0_1) {
        *(short *)(pSrc + (ulong)s_tdefl_len_sym[s0_1 - 3] * 2 + 0x81ca) =
             *(short *)(pSrc + (ulong)s_tdefl_len_sym[s0_1 - 3] * 2 + 0x81ca) + 1;
      }
      cur_match_len = *(int *)(pSrc + 0x68) - 1;
      pSrc[0x68] = '\0';
      pSrc[0x69] = '\0';
      pSrc[0x6a] = '\0';
      pSrc[0x6b] = '\0';
    }
    *(mz_uint *)(pSrc + 0x24) = cur_match_len + *(int *)(pSrc + 0x24);
    if (*(uint *)(pSrc + 0x28) < cur_match_len) {
      __assert_fail("d->m_lookahead_size >= len_to_move",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/miniz/miniz.c"
                    ,0x737,"mz_bool tdefl_compress_normal(tdefl_compressor *)");
    }
    *(mz_uint *)(pSrc + 0x28) = *(int *)(pSrc + 0x28) - cur_match_len;
    if (*(int *)(pSrc + 0x2c) + cur_match_len < 0x8000) {
      local_1cc = *(int *)(pSrc + 0x2c) + cur_match_len;
    }
    else {
      local_1cc = 0x8000;
    }
    *(int *)(pSrc + 0x2c) = local_1cc;
    if ((pSrc + 0x192a2 < *(mz_uint8 **)(pSrc + 0x30)) ||
       ((0x7c00 < *(uint *)(pSrc + 0x54) &&
        ((*(uint *)(pSrc + 0x54) <=
          (uint)(((int)*(undefined8 *)(pSrc + 0x30) - ((int)pSrc + 0x92aa)) * 0x73) >> 7 ||
         ((*(uint *)(pSrc + 0x10) & 0x80000) != 0)))))) {
      *(size_t *)(pSrc + 0xb0) = src_buf_left;
      *(size_t *)(pSrc + 0xb8) = _len_to_move;
      iVar8 = tdefl_flush_block((tdefl_compressor *)pSrc,0);
      if (iVar8 != 0) {
        return (uint)(-1 < iVar8);
      }
    }
  }
  *(size_t *)(pSrc + 0xb0) = src_buf_left;
  *(size_t *)(pSrc + 0xb8) = _len_to_move;
  return 1;
LAB_00197b31:
  probe_len = num_probes_left & 0x7fff;
  mVar4 = TDEFL_READ_UNALIGNED_WORD(local_78 + (ulong)((probe_len + next_probe_pos) - 1) + 200);
  if (mVar4 == d_local._6_2_) {
LAB_00197b7b:
    if (match_len == 0) goto LAB_00197e4c;
    pmStack_d0 = (mz_uint16 *)(local_78 + (ulong)probe_len + 200);
    mVar4 = TDEFL_READ_UNALIGNED_WORD2(pmStack_d0);
    if (mVar4 == d_local._4_2_) {
      q = p;
      local_b0 = 0x20;
      do {
        q = q + 1;
        mVar4 = TDEFL_READ_UNALIGNED_WORD2(q);
        pmStack_d0 = pmStack_d0 + 1;
        mVar5 = TDEFL_READ_UNALIGNED_WORD2(pmStack_d0);
        bVar10 = false;
        if (mVar4 == mVar5) {
          q = q + 1;
          mVar4 = TDEFL_READ_UNALIGNED_WORD2(q);
          pmStack_d0 = pmStack_d0 + 1;
          mVar5 = TDEFL_READ_UNALIGNED_WORD2(pmStack_d0);
          bVar10 = false;
          if (mVar4 == mVar5) {
            q = q + 1;
            mVar4 = TDEFL_READ_UNALIGNED_WORD2(q);
            pmStack_d0 = pmStack_d0 + 1;
            mVar5 = TDEFL_READ_UNALIGNED_WORD2(pmStack_d0);
            bVar10 = false;
            if (mVar4 == mVar5) {
              q = q + 1;
              mVar4 = TDEFL_READ_UNALIGNED_WORD2(q);
              pmStack_d0 = pmStack_d0 + 1;
              mVar5 = TDEFL_READ_UNALIGNED_WORD2(pmStack_d0);
              bVar10 = false;
              if (mVar4 == mVar5) {
                local_b0 = local_b0 - 1;
                bVar10 = local_b0 != 0;
              }
            }
          }
        }
      } while (bVar10);
      if (local_b0 == 0) {
        *local_90 = match_len;
        if (local_84 < 0x102) {
          local_16c = local_84;
        }
        else {
          local_16c = 0x102;
        }
        *_pos = local_16c;
        goto LAB_00197e4c;
      }
      local_b0 = (int)((long)q - (long)p >> 1) * 2 + (uint)((char)*q == (char)*pmStack_d0);
      if (next_probe_pos < local_b0) {
        *local_90 = match_len;
        if (local_84 < local_b0) {
          local_170 = local_84;
        }
        else {
          local_170 = local_b0;
        }
        next_probe_pos = local_170;
        *_pos = local_170;
        if (local_170 == local_84) goto LAB_00197e4c;
        d_local._6_2_ =
             TDEFL_READ_UNALIGNED_WORD(local_78 + (ulong)((probe_pos + next_probe_pos) - 1) + 200);
      }
    }
  }
  goto LAB_001979d1;
}

Assistant:

static mz_bool tdefl_compress_normal(tdefl_compressor *d)
{
    const mz_uint8 *pSrc = d->m_pSrc;
    size_t src_buf_left = d->m_src_buf_left;
    tdefl_flush flush = d->m_flush;

    while ((src_buf_left) || ((flush) && (d->m_lookahead_size)))
    {
        mz_uint len_to_move, cur_match_dist, cur_match_len, cur_pos;
        /* Update dictionary and hash chains. Keeps the lookahead size equal to TDEFL_MAX_MATCH_LEN. */
        if ((d->m_lookahead_size + d->m_dict_size) >= (TDEFL_MIN_MATCH_LEN - 1))
        {
            mz_uint dst_pos = (d->m_lookahead_pos + d->m_lookahead_size) & TDEFL_LZ_DICT_SIZE_MASK, ins_pos = d->m_lookahead_pos + d->m_lookahead_size - 2;
            mz_uint hash = (d->m_dict[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] << TDEFL_LZ_HASH_SHIFT) ^ d->m_dict[(ins_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK];
            mz_uint num_bytes_to_process = (mz_uint)MZ_MIN(src_buf_left, TDEFL_MAX_MATCH_LEN - d->m_lookahead_size);
            const mz_uint8 *pSrc_end = pSrc + num_bytes_to_process;
            src_buf_left -= num_bytes_to_process;
            d->m_lookahead_size += num_bytes_to_process;
            while (pSrc != pSrc_end)
            {
                mz_uint8 c = *pSrc++;
                d->m_dict[dst_pos] = c;
                if (dst_pos < (TDEFL_MAX_MATCH_LEN - 1))
                    d->m_dict[TDEFL_LZ_DICT_SIZE + dst_pos] = c;
                hash = ((hash << TDEFL_LZ_HASH_SHIFT) ^ c) & (TDEFL_LZ_HASH_SIZE - 1);
                d->m_next[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] = d->m_hash[hash];
                d->m_hash[hash] = (mz_uint16)(ins_pos);
                dst_pos = (dst_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK;
                ins_pos++;
            }
        }
        else
        {
            while ((src_buf_left) && (d->m_lookahead_size < TDEFL_MAX_MATCH_LEN))
            {
                mz_uint8 c = *pSrc++;
                mz_uint dst_pos = (d->m_lookahead_pos + d->m_lookahead_size) & TDEFL_LZ_DICT_SIZE_MASK;
                src_buf_left--;
                d->m_dict[dst_pos] = c;
                if (dst_pos < (TDEFL_MAX_MATCH_LEN - 1))
                    d->m_dict[TDEFL_LZ_DICT_SIZE + dst_pos] = c;
                if ((++d->m_lookahead_size + d->m_dict_size) >= TDEFL_MIN_MATCH_LEN)
                {
                    mz_uint ins_pos = d->m_lookahead_pos + (d->m_lookahead_size - 1) - 2;
                    mz_uint hash = ((d->m_dict[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] << (TDEFL_LZ_HASH_SHIFT * 2)) ^ (d->m_dict[(ins_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK] << TDEFL_LZ_HASH_SHIFT) ^ c) & (TDEFL_LZ_HASH_SIZE - 1);
                    d->m_next[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] = d->m_hash[hash];
                    d->m_hash[hash] = (mz_uint16)(ins_pos);
                }
            }
        }
        d->m_dict_size = MZ_MIN(TDEFL_LZ_DICT_SIZE - d->m_lookahead_size, d->m_dict_size);
        if ((!flush) && (d->m_lookahead_size < TDEFL_MAX_MATCH_LEN))
            break;

        /* Simple lazy/greedy parsing state machine. */
        len_to_move = 1;
        cur_match_dist = 0;
        cur_match_len = d->m_saved_match_len ? d->m_saved_match_len : (TDEFL_MIN_MATCH_LEN - 1);
        cur_pos = d->m_lookahead_pos & TDEFL_LZ_DICT_SIZE_MASK;
        if (d->m_flags & (TDEFL_RLE_MATCHES | TDEFL_FORCE_ALL_RAW_BLOCKS))
        {
            if ((d->m_dict_size) && (!(d->m_flags & TDEFL_FORCE_ALL_RAW_BLOCKS)))
            {
                mz_uint8 c = d->m_dict[(cur_pos - 1) & TDEFL_LZ_DICT_SIZE_MASK];
                cur_match_len = 0;
                while (cur_match_len < d->m_lookahead_size)
                {
                    if (d->m_dict[cur_pos + cur_match_len] != c)
                        break;
                    cur_match_len++;
                }
                if (cur_match_len < TDEFL_MIN_MATCH_LEN)
                    cur_match_len = 0;
                else
                    cur_match_dist = 1;
            }
        }
        else
        {
            tdefl_find_match(d, d->m_lookahead_pos, d->m_dict_size, d->m_lookahead_size, &cur_match_dist, &cur_match_len);
        }
        if (((cur_match_len == TDEFL_MIN_MATCH_LEN) && (cur_match_dist >= 8U * 1024U)) || (cur_pos == cur_match_dist) || ((d->m_flags & TDEFL_FILTER_MATCHES) && (cur_match_len <= 5)))
        {
            cur_match_dist = cur_match_len = 0;
        }
        if (d->m_saved_match_len)
        {
            if (cur_match_len > d->m_saved_match_len)
            {
                tdefl_record_literal(d, (mz_uint8)d->m_saved_lit);
                if (cur_match_len >= 128)
                {
                    tdefl_record_match(d, cur_match_len, cur_match_dist);
                    d->m_saved_match_len = 0;
                    len_to_move = cur_match_len;
                }
                else
                {
                    d->m_saved_lit = d->m_dict[cur_pos];
                    d->m_saved_match_dist = cur_match_dist;
                    d->m_saved_match_len = cur_match_len;
                }
            }
            else
            {
                tdefl_record_match(d, d->m_saved_match_len, d->m_saved_match_dist);
                len_to_move = d->m_saved_match_len - 1;
                d->m_saved_match_len = 0;
            }
        }
        else if (!cur_match_dist)
            tdefl_record_literal(d, d->m_dict[MZ_MIN(cur_pos, sizeof(d->m_dict) - 1)]);
        else if ((d->m_greedy_parsing) || (d->m_flags & TDEFL_RLE_MATCHES) || (cur_match_len >= 128))
        {
            tdefl_record_match(d, cur_match_len, cur_match_dist);
            len_to_move = cur_match_len;
        }
        else
        {
            d->m_saved_lit = d->m_dict[MZ_MIN(cur_pos, sizeof(d->m_dict) - 1)];
            d->m_saved_match_dist = cur_match_dist;
            d->m_saved_match_len = cur_match_len;
        }
        /* Move the lookahead forward by len_to_move bytes. */
        d->m_lookahead_pos += len_to_move;
        MZ_ASSERT(d->m_lookahead_size >= len_to_move);
        d->m_lookahead_size -= len_to_move;
        d->m_dict_size = MZ_MIN(d->m_dict_size + len_to_move, (mz_uint)TDEFL_LZ_DICT_SIZE);
        /* Check if it's time to flush the current LZ codes to the internal output buffer. */
        if ((d->m_pLZ_code_buf > &d->m_lz_code_buf[TDEFL_LZ_CODE_BUF_SIZE - 8]) ||
            ((d->m_total_lz_bytes > 31 * 1024) && (((((mz_uint)(d->m_pLZ_code_buf - d->m_lz_code_buf) * 115) >> 7) >= d->m_total_lz_bytes) || (d->m_flags & TDEFL_FORCE_ALL_RAW_BLOCKS))))
        {
            int n;
            d->m_pSrc = pSrc;
            d->m_src_buf_left = src_buf_left;
            if ((n = tdefl_flush_block(d, 0)) != 0)
                return (n < 0) ? MZ_FALSE : MZ_TRUE;
        }
    }

    d->m_pSrc = pSrc;
    d->m_src_buf_left = src_buf_left;
    return MZ_TRUE;
}